

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_operation.h
# Opt level: O1

void mocker::
     subSet<std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>,std::unordered_set<unsigned_long,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<unsigned_long>>>
               (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                *s,unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *o)

{
  _Hash_node_base *p_Var1;
  __node_base_ptr p_Var2;
  _Node_iterator_base<unsigned_long,_false> __it;
  
  for (p_Var1 = (o->_M_h)._M_before_begin._M_nxt; p_Var1 != (_Hash_node_base *)0x0;
      p_Var1 = p_Var1->_M_nxt) {
    p_Var2 = std::
             _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::_M_find_before_node
                       (&s->_M_h,(ulong)p_Var1[1]._M_nxt % (s->_M_h)._M_bucket_count,
                        (key_type *)(p_Var1 + 1),(__hash_code)p_Var1[1]._M_nxt);
    __it._M_cur = (__node_type *)0x0;
    if (p_Var2 != (__node_base_ptr)0x0) {
      __it._M_cur = (__node_type *)p_Var2->_M_nxt;
    }
    if (__it._M_cur != (__node_type *)0x0) {
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::erase(&s->_M_h,(const_iterator)__it._M_cur);
    }
  }
  return;
}

Assistant:

void subSet(Set &s, const Iterable &o) {
  for (auto &v : o) {
    auto iter = s.find(v);
    if (iter != s.end())
      s.erase(iter);
  }
}